

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

bool __thiscall
libtorrent::peer_list::update_peer_port
          (peer_list *this,int port,torrent_peer *p,peer_source_flags_t src,torrent_state *state)

{
  torrent_peer *p_00;
  peer_connection_interface *ppVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  match_peer_endpoint __pred;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  i;
  address addr;
  error_code local_e8;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_d8;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_b8;
  iterator local_98;
  pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
  range;
  
  if ((uint)p->port != port) {
    if (state->allow_multiple_connections_per_ip != false) {
      torrent_peer::address(p);
      find_peers(&range,this,&addr);
      local_b8._M_cur = range.first._M_cur;
      local_b8._M_first = range.first._M_first;
      local_b8._M_last = range.first._M_last;
      local_b8._M_node = range.first._M_node;
      local_d8._M_cur = range.second._M_cur;
      local_d8._M_first = range.second._M_first;
      local_d8._M_last = range.second._M_last;
      local_d8._M_node = range.second._M_node;
      __pred._8_4_ = port;
      __pred.m_addr = &addr;
      __pred._12_4_ = 0;
      std::
      find_if<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
                (&i,&local_b8,&local_d8,__pred);
      if (i._M_cur != range.second._M_cur) {
        p_00 = *i._M_cur;
        if (p_00->connection != (peer_connection_interface *)0x0) {
          bVar2 = is_connect_candidate(this,p_00);
          *(uint *)&p_00->field_0x1b =
               (src.m_val & 0x3f) << 0x10 | *(uint *)&p_00->field_0x1b | 0x20;
          if ((!bVar2) && (bVar2 = is_connect_candidate(this,p_00), bVar2)) {
            this->m_num_connect_candidates = this->m_num_connect_candidates + 1;
          }
          this->m_locked_peer = p;
          ppVar1 = p->connection;
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_e8,duplicate_peer_id,(type *)0x0);
          (*ppVar1->_vptr_peer_connection_interface[2])(ppVar1,&local_e8,1,0);
          this->m_locked_peer = (torrent_peer *)0x0;
          erase_peer(this,p,state);
          return false;
        }
        local_98._M_cur = i._M_cur;
        local_98._M_first = i._M_first;
        local_98._M_last = i._M_last;
        local_98._M_node = i._M_node;
        erase_peer(this,&local_98,state);
      }
    }
    bVar2 = is_connect_candidate(this,p);
    p->port = (uint16_t)port;
    *(uint *)&p->field_0x1b = (src.m_val & 0x3f) << 0x10 | *(uint *)&p->field_0x1b | 0x20;
    bVar3 = is_connect_candidate(this,p);
    if (bVar2 != bVar3) {
      iVar4 = (-(uint)bVar2 | 1) + this->m_num_connect_candidates;
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      if (!bVar2) {
        iVar5 = iVar4;
      }
      this->m_num_connect_candidates = iVar5;
    }
  }
  return true;
}

Assistant:

bool peer_list::update_peer_port(int const port, torrent_peer* p
		, peer_source_flags_t const src, torrent_state* state)
	{
		TORRENT_ASSERT(p != nullptr);
		TORRENT_ASSERT(p->connection);
		TORRENT_ASSERT(p->in_use);
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		if (p->port == port) return true;

		if (state->allow_multiple_connections_per_ip)
		{
			auto const addr = p->address();
			auto const range = find_peers(addr);
			auto const i = std::find_if(range.first, range.second
				, match_peer_endpoint(addr, std::uint16_t(port)));
			if (i != range.second)
			{
				torrent_peer& pp = **i;
				TORRENT_ASSERT(pp.in_use);
				if (pp.connection)
				{
					bool const was_conn_cand = is_connect_candidate(pp);
					// if we already have an entry with this
					// new endpoint, disconnect this one
					pp.connectable = true;
					pp.source |= static_cast<std::uint8_t>(src);
					if (!was_conn_cand && is_connect_candidate(pp))
						update_connect_candidates(1);
					// calling disconnect() on a peer, may actually end
					// up "garbage collecting" its torrent_peer entry
					// as well, if it's considered useless (which this specific)
					// case will, since it was an incoming peer that just disconnected
					// and we allow multiple connections per IP. Because of that,
					// we need to make sure we don't let it do that, locking i
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = p;
					p->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
					erase_peer(p, state);
					return false;
				}
				erase_peer(i, state);
			}
		}
#if TORRENT_USE_ASSERTS
		else
		{
#if TORRENT_USE_I2P
			if (!p->is_i2p_addr)
#endif
			{
				std::pair<iterator, iterator> range = find_peers(p->address());
				TORRENT_ASSERT(std::distance(range.first, range.second) == 1);
			}
		}
#endif

		bool const was_conn_cand = is_connect_candidate(*p);
		p->port = std::uint16_t(port);
		p->source |= static_cast<std::uint8_t>(src);
		p->connectable = true;

		if (was_conn_cand != is_connect_candidate(*p))
			update_connect_candidates(was_conn_cand ? -1 : 1);
		return true;
	}